

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* nlohmann::
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *__return_storage_ptr__,string *reference_string)

{
  long lVar1;
  long lVar2;
  parse_error *ppVar3;
  long *plVar4;
  size_type *psVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reference_token;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (reference_string->_M_string_length != 0) {
    if (*(reference_string->_M_dataplus)._M_p != '/') {
      ppVar3 = (parse_error *)__cxa_allocate_exception(0x28);
      std::operator+(&local_50,"JSON pointer must be empty or begin with \'/\' - was: \'",
                     reference_string);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70._M_dataplus._M_p = (pointer)*plVar4;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      detail::parse_error::create(ppVar3,0x6b,1,&local_70);
      __cxa_throw(ppVar3,&detail::parse_error::typeinfo,detail::exception::~exception);
    }
    lVar1 = std::__cxx11::string::find((char)reference_string,0x2f);
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)reference_string);
      while (lVar2 = std::__cxx11::string::find((char)&local_70,0x7e), lVar2 != -1) {
        if (local_70._M_dataplus._M_p[lVar2] != '~') {
          __assert_fail("reference_token[pos] == \'~\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0x28ee,
                        "static std::vector<std::string> nlohmann::json_pointer<nlohmann::basic_json<>>::split(const std::string &) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if ((lVar2 == local_70._M_string_length - 1) ||
           ((local_70._M_dataplus._M_p[lVar2 + 1] & 0xfeU) != 0x30)) {
          ppVar3 = (parse_error *)__cxa_allocate_exception(0x28);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "escape character \'~\' must be followed with \'0\' or \'1\'","");
          detail::parse_error::create(ppVar3,0x6c,0,&local_50);
          __cxa_throw(ppVar3,&detail::parse_error::typeinfo,detail::exception::~exception);
        }
      }
      unescape(&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      lVar2 = std::__cxx11::string::find((char)reference_string,0x2f);
      bVar6 = lVar1 != -1;
      lVar1 = lVar2;
    } while (bVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> split(const std::string& reference_string) {
		std::vector<std::string> result;

		// special case: empty reference string -> no reference tokens
		if (reference_string.empty()) {
			return result;
		}

		// check if nonempty reference string begins with slash
		if (JSON_UNLIKELY(reference_string[0] != '/')) {
			JSON_THROW(detail::parse_error::create(
				107, 1, "JSON pointer must be empty or begin with '/' - was: '" + reference_string + "'"));
		}

		// extract the reference tokens:
		// - slash: position of the last read slash (or end of string)
		// - start: position after the previous slash
		for (
			// search for the first slash after the first character
			std::size_t slash = reference_string.find_first_of('/', 1),
						// set the beginning of the first reference token
			start = 1;
			// we can stop if start == 0 (if slash == std::string::npos)
			start != 0;
			// set the beginning of the next reference token
			// (will eventually be 0 if slash == std::string::npos)
			start = (slash == std::string::npos) ? 0 : slash + 1,
						// find next slash
			slash = reference_string.find_first_of('/', start)) {
			// use the text between the beginning of the reference token
			// (start) and the last slash (slash).
			auto reference_token = reference_string.substr(start, slash - start);

			// check reference tokens are properly escaped
			for (std::size_t pos = reference_token.find_first_of('~'); pos != std::string::npos;
				 pos = reference_token.find_first_of('~', pos + 1)) {
				assert(reference_token[pos] == '~');

				// ~ must be followed by 0 or 1
				if (JSON_UNLIKELY(pos == reference_token.size() - 1 or
								  (reference_token[pos + 1] != '0' and reference_token[pos + 1] != '1'))) {
					JSON_THROW(
						detail::parse_error::create(108, 0, "escape character '~' must be followed with '0' or '1'"));
				}
			}

			// finally, store the reference token
			unescape(reference_token);
			result.push_back(reference_token);
		}

		return result;
	}